

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O1

void xemmai::t_finalizes<xemmai::t_derives<xemmai::t_scope,_xemmai::t_type_of<xemmai::t_object>_>_>
     ::f_do_finalize(t_object *a_this,t_scan a_scan)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  
  (*a_scan)(*(t_object **)(a_this->v_data + 8));
  lVar2 = *(long *)a_this->v_data;
  if (0 < lVar2) {
    pcVar3 = a_this->v_data;
    do {
      pcVar1 = pcVar3 + 0x10;
      pcVar3 = pcVar3 + 0x10;
      (*a_scan)(*(t_object **)pcVar1);
    } while (pcVar3 < a_this->v_data + lVar2 * 0x10);
  }
  return;
}

Assistant:

void t_finalizes<T_base>::f_do_finalize(t_object* a_this, t_scan a_scan)
{
	using t = typename T_base::t_what;
	t_type_of<t>::f_do_scan(a_this, a_scan);
	a_this->f_as<t>().~t();
}